

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asc2log.c
# Opt level: O1

void get_can_id(canid_t *can_id,char *idstring,int base)

{
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = strlen(idstring);
  if (idstring[sVar1 - 1] == 'x') {
    *can_id = 0x80000000;
    sVar1 = strlen(idstring);
    idstring[sVar1 - 1] = '\0';
  }
  else {
    *can_id = 0;
  }
  uVar2 = strtoul(idstring,(char **)0x0,base);
  *can_id = *can_id | (uint)uVar2;
  return;
}

Assistant:

static void get_can_id(canid_t *can_id, char *idstring, int base)
{
	if (idstring[strlen(idstring)-1] == 'x') {
		*can_id = CAN_EFF_FLAG;
		idstring[strlen(idstring)-1] = 0;
	} else
		*can_id = 0;
    
	*can_id |= strtoul(idstring, NULL, base);
}